

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O1

void __thiscall
icu_63::numparse::impl::AffixMatcherWarehouse::AffixMatcherWarehouse
          (AffixMatcherWarehouse *this,AffixTokenMatcherWarehouse *tokenWarehouse)

{
  long lVar1;
  ArraySeriesMatcher *this_00;
  
  lVar1 = 0;
  do {
    *(undefined ***)
     ((long)&this->fAffixMatchers[0].super_NumberParseMatcher._vptr_NumberParseMatcher + lVar1) =
         &PTR__NumberParseMatcher_003dadc8;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x120);
  this_00 = &this->fAffixPatternMatchers[0].super_ArraySeriesMatcher;
  lVar1 = 0;
  do {
    ArraySeriesMatcher::ArraySeriesMatcher(this_00);
    (this_00->super_SeriesMatcher).super_CompositionMatcher.super_NumberParseMatcher.
    _vptr_NumberParseMatcher = (_func_int **)&PTR__AffixPatternMatcher_003d9d90;
    this_00[1].super_SeriesMatcher.super_CompositionMatcher.super_NumberParseMatcher.
    _vptr_NumberParseMatcher = (_func_int **)((long)&this_00[1].fMatchers.ptr + 6);
    *(undefined4 *)&this_00[1].fMatchers.ptr = 4;
    *(undefined1 *)((long)&this_00[1].fMatchers.ptr + 4) = 0;
    *(undefined2 *)((long)&this_00[1].fMatchers.ptr + 6) = 0;
    lVar1 = lVar1 + -0x50;
    this_00 = (ArraySeriesMatcher *)this_00[1].fMatchers.stackArray;
  } while (lVar1 != -0x1e0);
  this->fTokenWarehouse = tokenWarehouse;
  return;
}

Assistant:

AffixMatcherWarehouse::AffixMatcherWarehouse(AffixTokenMatcherWarehouse* tokenWarehouse)
        : fTokenWarehouse(tokenWarehouse) {
}